

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glist.c
# Opt level: O1

glist_t glist_reverse(glist_t g)

{
  gnode_s *pgVar1;
  glist_t pgVar2;
  glist_t pgVar3;
  gnode_t *gn;
  
  if (g != (glist_t)0x0) {
    pgVar3 = (glist_t)0x0;
    do {
      pgVar2 = g;
      pgVar1 = g->next;
      g->next = pgVar3;
      pgVar3 = g;
      g = pgVar1;
    } while (pgVar1 != (gnode_s *)0x0);
    return pgVar2;
  }
  return (glist_t)0x0;
}

Assistant:

glist_t
glist_reverse(glist_t g)
{
    gnode_t *gn, *nextgn;
    gnode_t *rev;

    rev = NULL;
    for (gn = g; gn; gn = nextgn) {
        nextgn = gn->next;

        gn->next = rev;
        rev = gn;
    }

    return rev;
}